

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O3

void __thiscall Mapper004::switchBanks(Mapper004 *this)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  uint uVar4;
  
  if (this->rommode == '\x01') {
    uVar4 = (uint)this->params->sizePrgRom * 2;
    this->ROMBanks[0] = 0xfeU % uVar4 << 0xd;
    this->ROMBanks[1] = (uint)this->regs[7] % uVar4 << 0xd;
    uVar2 = (ushort)this->regs[6];
  }
  else {
    if (this->rommode != '\0') goto LAB_00111903;
    uVar4 = (uint)this->params->sizePrgRom * 2;
    this->ROMBanks[0] = (uint)this->regs[6] % uVar4 << 0xd;
    this->ROMBanks[1] = (uint)this->regs[7] % uVar4 << 0xd;
    uVar2 = 0xfe;
  }
  *(ulong *)(this->ROMBanks + 2) = CONCAT44(0xffU % uVar4 << 0xd,(uint)uVar2 % uVar4 << 0xd);
LAB_00111903:
  if (this->vrommode == '\x01') {
    bVar1 = this->params->sizeChrRom;
    this->VROMBanks[0] = (uint)this->regs[2] % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[1] = (uint)this->regs[3] % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[2] = (uint)this->regs[4] % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[3] = (uint)this->regs[5] % ((uint)bVar1 << 3) << 10;
    bVar3 = this->regs[0];
    this->VROMBanks[4] = (bVar3 & 0xfffffffe) % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[5] = (bVar3 | 1) % ((uint)bVar1 << 3) << 10;
    bVar3 = this->regs[1];
    this->VROMBanks[6] = (bVar3 & 0xfffffffe) % ((uint)bVar1 << 3) << 10;
    bVar3 = bVar3 | 1;
  }
  else {
    if (this->vrommode != '\0') {
      return;
    }
    bVar1 = this->params->sizeChrRom;
    this->VROMBanks[0] = (this->regs[0] & 0xfffffffe) % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[1] = (this->regs[0] | 1) % ((uint)bVar1 << 3) << 10;
    bVar3 = this->regs[1];
    this->VROMBanks[2] = (bVar3 & 0xfffffffe) % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[3] = (bVar3 | 1) % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[4] = (uint)this->regs[2] % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[5] = (uint)this->regs[3] % ((uint)bVar1 << 3) << 10;
    this->VROMBanks[6] = (uint)this->regs[4] % ((uint)bVar1 << 3) << 10;
    bVar3 = this->regs[5];
  }
  this->VROMBanks[7] = (uint)bVar3 % ((uint)bVar1 << 3) << 10;
  return;
}

Assistant:

void Mapper004::switchBanks() {
    if (rommode == 0) {
        ROMBanks[0] = calcRBankOffset(regs[6]);
        ROMBanks[1] = calcRBankOffset(regs[7]);
        ROMBanks[2] = calcRBankOffset(-2);
        ROMBanks[3] = calcRBankOffset(-1);
    } else if (rommode == 1) {
        ROMBanks[0] = calcRBankOffset(-2);
        ROMBanks[1] = calcRBankOffset(regs[7]);
        ROMBanks[2] = calcRBankOffset(regs[6]);
        ROMBanks[3] = calcRBankOffset(-1);
    }

    if (vrommode == 0) {
        VROMBanks[0] = calcVBankOffset(regs[0] & 0xFE);
        VROMBanks[1] = calcVBankOffset(regs[0] | 0x01);
        VROMBanks[2] = calcVBankOffset(regs[1] & 0xFE);
        VROMBanks[3] = calcVBankOffset(regs[1] | 0x01);
        VROMBanks[4] = calcVBankOffset(regs[2]);
        VROMBanks[5] = calcVBankOffset(regs[3]);
        VROMBanks[6] = calcVBankOffset(regs[4]);
        VROMBanks[7] = calcVBankOffset(regs[5]);
    } else if (vrommode == 1) {
        VROMBanks[0] = calcVBankOffset(regs[2]);
        VROMBanks[1] = calcVBankOffset(regs[3]);
        VROMBanks[2] = calcVBankOffset(regs[4]);
        VROMBanks[3] = calcVBankOffset(regs[5]);
        VROMBanks[4] = calcVBankOffset(regs[0] & 0xFE);
        VROMBanks[5] = calcVBankOffset(regs[0] | 0x01);
        VROMBanks[6] = calcVBankOffset(regs[1] & 0xFE);
        VROMBanks[7] = calcVBankOffset(regs[1] | 0x01);
    }
}